

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

void Bbl_ManTestTruth(char *pSop,int nVars)

{
  uint *pTruth_00;
  char *__ptr;
  char *pSopNew;
  uint *pTruth;
  int nVars_local;
  char *pSop_local;
  
  pTruth_00 = Bbl_ManSopToTruth(pSop,nVars);
  __ptr = Bbl_ManTruthToSop(pTruth_00,nVars);
  printf("Old SOP:\n%s\n",pSop);
  printf("New SOP:\n%s\n",__ptr);
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  if (pTruth_00 != (uint *)0x0) {
    free(pTruth_00);
  }
  return;
}

Assistant:

void Bbl_ManTestTruth( char * pSop, int nVars )
{
    unsigned * pTruth;
    char * pSopNew;
    pTruth = Bbl_ManSopToTruth( pSop, nVars );
    pSopNew = Bbl_ManTruthToSop( pTruth, nVars );
    printf( "Old SOP:\n%s\n", pSop );
    printf( "New SOP:\n%s\n", pSopNew );
    BBLIF_FREE( pSopNew );
    BBLIF_FREE( pTruth );
}